

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# Image.cpp
# Opt level: O0

intMatrix * __thiscall Image::getBinaryMatrix(intMatrix *__return_storage_ptr__,Image *this)

{
  value_type vVar1;
  size_type __n;
  byte *pbVar2;
  reference this_00;
  reference pvVar3;
  int in_R8D;
  int local_e4;
  int local_e0;
  int j;
  int i;
  undefined1 local_b9;
  _InputArray local_b8;
  _InputArray local_90;
  Mat local_78 [8];
  Mat tmp_gray_img;
  int local_6c;
  Image *this_local;
  intMatrix *binary_matrix;
  
  cv::Mat::Mat(local_78,&this->content);
  cv::_InputArray::_InputArray(&local_90,local_78);
  cv::_OutputArray::_OutputArray((_OutputArray *)&local_b8,local_78);
  cv::cvtColor((cv *)&local_90,&local_b8,(_OutputArray *)0x6,0,in_R8D);
  cv::_OutputArray::~_OutputArray((_OutputArray *)&local_b8);
  cv::_InputArray::~_InputArray(&local_90);
  local_b9 = 0;
  __n = (size_type)_tmp_gray_img;
  std::allocator<int>::allocator((allocator<int> *)((long)&j + 3));
  std::vector<int,_std::allocator<int>_>::vector
            ((vector<int,_std::allocator<int>_> *)&i,(long)local_6c,(allocator<int> *)((long)&j + 3)
            );
  std::allocator<std::vector<int,_std::allocator<int>_>_>::allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 2));
  std::
  vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
  ::vector(__return_storage_ptr__,__n,(value_type *)&i,
           (allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 2));
  std::allocator<std::vector<int,_std::allocator<int>_>_>::~allocator
            ((allocator<std::vector<int,_std::allocator<int>_>_> *)((long)&j + 2));
  std::vector<int,_std::allocator<int>_>::~vector((vector<int,_std::allocator<int>_> *)&i);
  std::allocator<int>::~allocator((allocator<int> *)((long)&j + 3));
  for (local_e0 = 0; local_e0 < _tmp_gray_img; local_e0 = local_e0 + 1) {
    for (local_e4 = 0; local_e4 < local_6c; local_e4 = local_e4 + 1) {
      pbVar2 = cv::Mat::at<unsigned_char>(local_78,local_e0,local_e4);
      vVar1 = 0;
      if (0x96 < *pbVar2) {
        vVar1 = 0xff;
      }
      this_00 = std::
                vector<std::vector<int,_std::allocator<int>_>,_std::allocator<std::vector<int,_std::allocator<int>_>_>_>
                ::operator[](__return_storage_ptr__,(long)local_e0);
      pvVar3 = std::vector<int,_std::allocator<int>_>::operator[](this_00,(long)local_e4);
      *pvVar3 = vVar1;
    }
  }
  local_b9 = 1;
  cv::Mat::~Mat(local_78);
  return __return_storage_ptr__;
}

Assistant:

intMatrix Image::getBinaryMatrix(){
    cv::Mat tmp_gray_img = content;
    cv::cvtColor(tmp_gray_img, tmp_gray_img, cv::COLOR_BGR2GRAY);
    intMatrix binary_matrix(tmp_gray_img.rows, std::vector<int>(tmp_gray_img.cols));
    for(int i = 0; i<tmp_gray_img.rows;++i){
        for(int j=0; j<tmp_gray_img.cols;++j){
            binary_matrix[i][j] = (tmp_gray_img.at<uchar>(i, j) > THRESHOLD) ? ON : OFF;
        }
    }
    return binary_matrix;
}